

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cpp
# Opt level: O1

bool __thiscall
xscript::parser::ast::parse_variable_initializer
          (ast *this,
          unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_>
          *parent)

{
  bool bVar1;
  unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_> *parent_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> args;
  basic_string_view<char,_std::char_traits<char>_> local_50;
  string local_40;
  
  parent_00 = ast_node::add_child((parent->_M_t).
                                  super___uniq_ptr_impl<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_xscript::parser::ast_node_*,_std::default_delete<xscript::parser::ast_node>_>
                                  .super__Head_base<0UL,_xscript::parser::ast_node_*,_false>.
                                  _M_head_impl,VARIABLE_INITIALIZER);
  if ((this->cur_token).type == TK_ASSIGN) {
    next(this);
    bVar1 = parse_expression(this,parent_00,0xf);
    return bVar1;
  }
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"build_O1/src/CMakeFiles/xscript.dir/compiler_depend.ts","");
  local_50._M_len = 0xc;
  local_50._M_str = "\'=\' expected";
  args._M_len = 1;
  args._M_array = &local_50;
  process_failover(this,&local_40,0x1b6,args,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return false;
}

Assistant:

bool ast::parse_variable_initializer(std::unique_ptr<ast_node>& parent) {
    std::unique_ptr<ast_node>& node = parent->add_child(VARIABLE_INITIALIZER);

    if (cur_token != tokenizer::TK_ASSIGN) {
        return failover({"'=' expected"});
    }
    next();

    if (!parse_expression(node)) {
        return false;
    }

    return true;
}